

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aead_test.cc
# Opt level: O3

void anon_unknown.dwarf_2021d5::RunWycheproofTestCase(FileTest *t,EVP_AEAD *aead)

{
  EVP_AEAD *pEVar1;
  uint8_t *puVar2;
  void *pvVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  pointer puVar7;
  pointer *__ptr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__ptr_15;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pdVar8;
  char *pcVar9;
  pointer pcVar10;
  char *in_R9;
  ulong uVar11;
  size_t __n;
  pointer *__ptr_14;
  internal iVar12;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  undefined1 local_3f0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3e0;
  Bytes local_3d0;
  AssertHelper local_3c0;
  undefined1 local_3b8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3b0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> out;
  string tag_size_str;
  vector<unsigned_char,_std::allocator<unsigned_char>_> ct_and_tag;
  size_t out_len;
  WycheproofResult result;
  vector<unsigned_char,_std::allocator<unsigned_char>_> iv;
  vector<unsigned_char,_std::allocator<unsigned_char>_> aad;
  vector<unsigned_char,_std::allocator<unsigned_char>_> msg;
  vector<unsigned_char,_std::allocator<unsigned_char>_> ct;
  vector<unsigned_char,_std::allocator<unsigned_char>_> tag;
  vector<unsigned_char,_std::allocator<unsigned_char>_> key;
  ScopedEVP_AEAD_CTX ctx;
  
  pEVar1 = (EVP_AEAD *)((long)&ctx.ctx_.state + 8);
  ctx.ctx_.aead = pEVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&ctx,"ivSize","");
  FileTest::HasInstruction(t,(string *)&ctx);
  if (ctx.ctx_.aead != pEVar1) {
    operator_delete(ctx.ctx_.aead,ctx.ctx_.state._8_8_ + 1);
  }
  aad.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  aad.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  aad.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ct.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ct.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ct.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  iv.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iv.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  iv.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  msg.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  msg.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  msg.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  tag.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tag.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  tag.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ctx.ctx_.aead = pEVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&ctx,"aad","");
  bVar4 = FileTest::GetBytes(t,&aad,(string *)&ctx);
  tag_size_str._M_dataplus._M_p._0_1_ = bVar4;
  tag_size_str._M_string_length = 0;
  if (ctx.ctx_.aead == pEVar1) {
    if (bVar4) goto LAB_00233016;
LAB_00233463:
    testing::Message::Message((Message *)&result);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&ctx,(internal *)&tag_size_str,
               (AssertionResult *)"t->GetBytes(&aad, \"aad\")","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_3f0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/aead_test.cc"
               ,0x389,(char *)ctx.ctx_.aead);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_3f0,(Message *)&result);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3f0);
    if (ctx.ctx_.aead != pEVar1) {
      operator_delete(ctx.ctx_.aead,ctx.ctx_.state._8_8_ + 1);
    }
    if (result._0_8_ != 0) {
      (**(code **)(*(long *)result._0_8_ + 8))();
    }
  }
  else {
    operator_delete(ctx.ctx_.aead,ctx.ctx_.state._8_8_ + 1);
    if (((ulong)tag_size_str._M_dataplus._M_p & 1) == 0) goto LAB_00233463;
LAB_00233016:
    if (tag_size_str._M_string_length != 0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&tag_size_str._M_string_length,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   tag_size_str._M_string_length);
    }
    ctx.ctx_.aead = pEVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&ctx,"ct","");
    bVar4 = FileTest::GetBytes(t,&ct,(string *)&ctx);
    tag_size_str._M_dataplus._M_p._0_1_ = bVar4;
    tag_size_str._M_string_length = 0;
    if (ctx.ctx_.aead == pEVar1) {
      if (bVar4) goto LAB_00233099;
LAB_00233521:
      testing::Message::Message((Message *)&result);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&ctx,(internal *)&tag_size_str,
                 (AssertionResult *)"t->GetBytes(&ct, \"ct\")","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_3f0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/aead_test.cc"
                 ,0x38a,(char *)ctx.ctx_.aead);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_3f0,(Message *)&result);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3f0);
      if (ctx.ctx_.aead != pEVar1) {
        operator_delete(ctx.ctx_.aead,ctx.ctx_.state._8_8_ + 1);
      }
      if (result._0_8_ != 0) {
        (**(code **)(*(long *)result._0_8_ + 8))();
      }
    }
    else {
      operator_delete(ctx.ctx_.aead,ctx.ctx_.state._8_8_ + 1);
      if (((ulong)tag_size_str._M_dataplus._M_p & 1) == 0) goto LAB_00233521;
LAB_00233099:
      if (tag_size_str._M_string_length != 0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&tag_size_str._M_string_length,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     tag_size_str._M_string_length);
      }
      ctx.ctx_.aead = pEVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&ctx,"iv","");
      bVar4 = FileTest::GetBytes(t,&iv,(string *)&ctx);
      tag_size_str._M_dataplus._M_p._0_1_ = bVar4;
      tag_size_str._M_string_length = 0;
      if (ctx.ctx_.aead == pEVar1) {
        if (!bVar4) {
LAB_002335df:
          testing::Message::Message((Message *)&result);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&ctx,(internal *)&tag_size_str,
                     (AssertionResult *)"t->GetBytes(&iv, \"iv\")","false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_3f0,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/aead_test.cc"
                     ,0x38b,(char *)ctx.ctx_.aead);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_3f0,(Message *)&result);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3f0);
          if (ctx.ctx_.aead != pEVar1) {
            operator_delete(ctx.ctx_.aead,ctx.ctx_.state._8_8_ + 1);
          }
          if (result._0_8_ != 0) {
            (**(code **)(*(long *)result._0_8_ + 8))();
          }
          goto joined_r0x00233748;
        }
      }
      else {
        operator_delete(ctx.ctx_.aead,ctx.ctx_.state._8_8_ + 1);
        if (((ulong)tag_size_str._M_dataplus._M_p & 1) == 0) goto LAB_002335df;
      }
      if (tag_size_str._M_string_length != 0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&tag_size_str._M_string_length,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     tag_size_str._M_string_length);
      }
      ctx.ctx_.aead = pEVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&ctx,"key","");
      bVar4 = FileTest::GetBytes(t,&key,(string *)&ctx);
      tag_size_str._M_dataplus._M_p._0_1_ = bVar4;
      tag_size_str._M_string_length = 0;
      if (ctx.ctx_.aead == pEVar1) {
        if (!bVar4) {
LAB_0023369d:
          testing::Message::Message((Message *)&result);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&ctx,(internal *)&tag_size_str,
                     (AssertionResult *)"t->GetBytes(&key, \"key\")","false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_3f0,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/aead_test.cc"
                     ,0x38c,(char *)ctx.ctx_.aead);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_3f0,(Message *)&result);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3f0);
          if (ctx.ctx_.aead != pEVar1) {
            operator_delete(ctx.ctx_.aead,ctx.ctx_.state._8_8_ + 1);
          }
          if (result._0_8_ != 0) {
            (**(code **)(*(long *)result._0_8_ + 8))();
          }
          goto joined_r0x00233748;
        }
      }
      else {
        operator_delete(ctx.ctx_.aead,ctx.ctx_.state._8_8_ + 1);
        if (((ulong)tag_size_str._M_dataplus._M_p & 1) == 0) goto LAB_0023369d;
      }
      if (tag_size_str._M_string_length != 0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&tag_size_str._M_string_length,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     tag_size_str._M_string_length);
      }
      ctx.ctx_.aead = pEVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&ctx,"msg","");
      bVar4 = FileTest::GetBytes(t,&msg,(string *)&ctx);
      tag_size_str._M_dataplus._M_p._0_1_ = bVar4;
      tag_size_str._M_string_length = 0;
      if (ctx.ctx_.aead == pEVar1) {
        if (bVar4) {
LAB_00233222:
          if (tag_size_str._M_string_length != 0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&tag_size_str._M_string_length,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         tag_size_str._M_string_length);
          }
          ctx.ctx_.aead = pEVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&ctx,"tag","");
          bVar4 = FileTest::GetBytes(t,&tag,(string *)&ctx);
          tag_size_str._M_dataplus._M_p._0_1_ = bVar4;
          tag_size_str._M_string_length = 0;
          if (ctx.ctx_.aead == pEVar1) {
            if (bVar4) goto LAB_002332a5;
          }
          else {
            operator_delete(ctx.ctx_.aead,ctx.ctx_.state._8_8_ + 1);
            if (((ulong)tag_size_str._M_dataplus._M_p & 1) != 0) {
LAB_002332a5:
              if (tag_size_str._M_string_length != 0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&tag_size_str._M_string_length,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             tag_size_str._M_string_length);
              }
              tag_size_str._M_dataplus._M_p = (pointer)&tag_size_str.field_2;
              tag_size_str._M_string_length = 0;
              tag_size_str.field_2._M_local_buf[0] = '\0';
              ctx.ctx_.aead = pEVar1;
              std::__cxx11::string::_M_construct<char_const*>((string *)&ctx,"tagSize","");
              bVar4 = FileTest::GetInstruction(t,&tag_size_str,(string *)&ctx);
              pdVar8 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&result.flags;
              result.raw_result._0_1_ = bVar4;
              result.flags.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              if (ctx.ctx_.aead == pEVar1) {
                if (bVar4) goto LAB_00233344;
LAB_00233996:
                testing::Message::Message((Message *)local_3f0);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&ctx,(internal *)&result,
                           (AssertionResult *)"t->GetInstruction(&tag_size_str, \"tagSize\")",
                           "false","true",in_R9);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&ct_and_tag,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/aead_test.cc"
                           ,0x390,(char *)ctx.ctx_.aead);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&ct_and_tag,(Message *)local_3f0);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&ct_and_tag);
                if (ctx.ctx_.aead != pEVar1) {
                  operator_delete(ctx.ctx_.aead,ctx.ctx_.state._8_8_ + 1);
                }
                if (local_3f0 != (undefined1  [8])0x0) {
                  (**(code **)(*(size_type *)local_3f0 + 8))();
                }
                ctx.ctx_.state.alignment =
                     (uint64_t)
                     result.flags.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
                if (result.flags.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
LAB_00233ba8:
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()(pdVar8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)ctx.ctx_.state.alignment);
                }
              }
              else {
                operator_delete(ctx.ctx_.aead,ctx.ctx_.state._8_8_ + 1);
                if ((result._0_8_ & 1) == 0) goto LAB_00233996;
LAB_00233344:
                if (result.flags.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()(pdVar8,result.flags.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
                }
                uVar5 = atoi(tag_size_str._M_dataplus._M_p);
                local_3f0 = (undefined1  [8])((ulong)(uint)local_3f0._4_4_ << 0x20);
                result._0_8_ = ZEXT48(uVar5 & 7);
                testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                          ((internal *)&ctx,"0u","tag_size % 8",(uint *)local_3f0,
                           (unsigned_long *)&result);
                if ((char)ctx.ctx_.aead == '\0') {
                  testing::Message::Message((Message *)&result);
                  if (ctx.ctx_.state.alignment == 0) {
                    pcVar9 = "";
                  }
                  else {
                    pcVar9 = *(char **)ctx.ctx_.state.alignment;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)local_3f0,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/aead_test.cc"
                             ,0x392,pcVar9);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)local_3f0,(Message *)&result);
                  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3f0);
                  if (result._0_8_ != 0) {
                    (**(code **)(*(long *)result._0_8_ + 8))();
                  }
                  if (ctx.ctx_.state.alignment == 0) goto LAB_00234864;
                  pdVar8 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&ctx.ctx_.state;
                  goto LAB_00233ba8;
                }
                if (ctx.ctx_.state.alignment != 0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)ctx.ctx_.state.opaque,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               ctx.ctx_.state.alignment);
                }
                result.flags.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                result.flags.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                result.flags.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                bVar4 = GetWycheproofResult(t,&result);
                local_3f0[0] = (internal)bVar4;
                local_3e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                ;
                if (bVar4) {
                  ct_and_tag.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  ct_and_tag.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                  ct_and_tag.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  uVar11 = (long)ct.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)ct.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start;
                  if (uVar11 == 0) {
                    puVar7 = (pointer)0x0;
                    __n = 0;
                  }
                  else {
                    if ((long)uVar11 < 0) {
                      std::__throw_bad_alloc();
                    }
                    puVar7 = (pointer)operator_new(uVar11);
                    __n = (long)ct.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)ct.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                ._M_impl.super__Vector_impl_data._M_start;
                  }
                  ct_and_tag.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage = puVar7 + uVar11;
                  ct_and_tag.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start = puVar7;
                  if (ct.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish !=
                      ct.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start) {
                    ct_and_tag.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish = puVar7;
                    memmove(puVar7,ct.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start,__n);
                  }
                  ct_and_tag.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish = puVar7 + __n;
                  std::vector<unsigned_char,std::allocator<unsigned_char>>::
                  _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&ct_and_tag,
                             ct_and_tag.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish,
                             tag.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start,
                             tag.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish);
                  EVP_AEAD_CTX_zero(&ctx.ctx_);
                  pcVar9 = (char *)0x0;
                  iVar6 = EVP_AEAD_CTX_init(&ctx.ctx_,aead,
                                            key.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_start,
                                            (long)key.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                            (long)key.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                            (ulong)(long)(int)uVar5 >> 3,(ENGINE *)0x0);
                  out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start._0_1_ = iVar6 != 0;
                  out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish = (pointer)0x0;
                  if (iVar6 == 0) {
                    testing::Message::Message((Message *)local_3b8);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)local_3f0,(internal *)&out,
                               (AssertionResult *)
                               "EVP_AEAD_CTX_init(ctx.get(), aead, key.data(), key.size(), tag_size, nullptr)"
                               ,"false","true",pcVar9);
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&local_3d0,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/aead_test.cc"
                               ,0x39c,(char *)local_3f0);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&local_3d0,(Message *)local_3b8);
                    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3d0);
                    if (local_3f0 != (undefined1  [8])&local_3e0) {
                      operator_delete((void *)local_3f0,local_3e0._M_allocated_capacity + 1);
                    }
                    if (local_3b8 != (undefined1  [8])0x0) {
                      (**(code **)(*(long *)local_3b8 + 8))();
                    }
                    if (out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
                      std::
                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&out.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_finish,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)out.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish);
                    }
                  }
                  else {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                              (&out,(long)msg.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)msg.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_start,
                               (allocator_type *)local_3f0);
                    local_3f0 = (undefined1  [8])&local_3e0;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_3f0,"SmallIv","");
                    __l._M_len = 1;
                    __l._M_array = (iterator)local_3f0;
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_3b8,__l,(allocator_type *)&local_3d0);
                    bVar4 = WycheproofResult::IsValid
                                      (&result,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                *)local_3b8);
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_3b8);
                    if (local_3f0 != (undefined1  [8])&local_3e0) {
                      operator_delete((void *)local_3f0,local_3e0._M_allocated_capacity + 1);
                    }
                    if (bVar4) {
                      puVar7 = iv.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish +
                               -(long)iv.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start;
                      iVar6 = EVP_AEAD_CTX_open(&ctx.ctx_,
                                                (uint8_t *)
                                                CONCAT71(out.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                                  out.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._0_1_),
                                                &out_len,(long)out.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)CONCAT71(out.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                                  out.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._0_1_),
                                                iv.
                                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                ._M_impl.super__Vector_impl_data._M_start,
                                                (size_t)puVar7,
                                                ct_and_tag.
                                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                ._M_impl.super__Vector_impl_data._M_start,
                                                (long)ct_and_tag.
                                                                                                            
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                (long)ct_and_tag.
                                                                                                            
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                aad.
                                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                ._M_impl.super__Vector_impl_data._M_start,
                                                (long)aad.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                (long)aad.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                      local_3b8[0] = (internal)(iVar6 != 0);
                      local_3b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0;
                      if (iVar6 == 0) {
                        testing::Message::Message((Message *)&local_3d0);
                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                  ((string *)local_3f0,(internal *)local_3b8,
                                   (AssertionResult *)
                                   "EVP_AEAD_CTX_open(ctx.get(), out.data(), &out_len, out.size(), iv.data(), iv.size(), ct_and_tag.data(), ct_and_tag.size(), aad.data(), aad.size())"
                                   ,"false","true",(char *)puVar7);
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_3c0,kFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/aead_test.cc"
                                   ,0x3a6,(char *)local_3f0);
                        testing::internal::AssertHelper::operator=(&local_3c0,(Message *)&local_3d0)
                        ;
                        testing::internal::AssertHelper::~AssertHelper(&local_3c0);
                        if (local_3f0 != (undefined1  [8])&local_3e0) {
                          operator_delete((void *)local_3f0,local_3e0._M_allocated_capacity + 1);
                        }
                        if ((long *)local_3d0.span_.data_ != (long *)0x0) {
                          (**(code **)(*(long *)local_3d0.span_.data_ + 8))();
                        }
                      }
                      else {
                        local_3b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)(msg.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_finish +
                                       -(long)msg.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_start);
                        local_3b8 = (undefined1  [8])
                                    msg.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start;
                        local_3d0.span_.data_ =
                             (uchar *)CONCAT71(out.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                               out.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_start._0_1_);
                        local_3d0.span_.size_ = out_len;
                        testing::internal::CmpHelperEQ<Bytes,Bytes>
                                  ((internal *)local_3f0,"Bytes(msg)","Bytes(out.data(), out_len)",
                                   (Bytes *)local_3b8,&local_3d0);
                        if (local_3f0[0] == (internal)0x0) {
                          testing::Message::Message((Message *)local_3b8);
                          if (local_3e8 ==
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0) {
                            pcVar10 = "";
                          }
                          else {
                            pcVar10 = (local_3e8->_M_dataplus)._M_p;
                          }
                          testing::internal::AssertHelper::AssertHelper
                                    ((AssertHelper *)&local_3d0,kNonFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/aead_test.cc"
                                     ,0x3a7,pcVar10);
                          testing::internal::AssertHelper::operator=
                                    ((AssertHelper *)&local_3d0,(Message *)local_3b8);
                          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3d0)
                          ;
                          if (local_3b8 != (undefined1  [8])0x0) {
                            (**(code **)(*(long *)local_3b8 + 8))();
                          }
                        }
                        if (local_3e8 !=
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                           ) {
                          std::
                          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&local_3e8,local_3e8);
                        }
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                                  (&out,&ct_and_tag);
                        puVar2 = (uint8_t *)
                                 CONCAT71(out.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                          out.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_start._0_1_);
                        puVar7 = iv.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish +
                                 -(long)iv.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_start;
                        iVar6 = EVP_AEAD_CTX_open(&ctx.ctx_,puVar2,&out_len,
                                                  (long)out.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)puVar2,
                                                  iv.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (size_t)puVar7,puVar2,
                                                  (long)out.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)puVar2,
                                                  aad.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)aad.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)aad.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                        local_3b8[0] = (internal)(iVar6 != 0);
                        local_3b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0;
                        if (iVar6 != 0) {
                          local_3b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)(msg.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_finish +
                                         -(long)msg.
                                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                ._M_impl.super__Vector_impl_data._M_start);
                          local_3b8 = (undefined1  [8])
                                      msg.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start;
                          local_3d0.span_.data_ =
                               (uchar *)CONCAT71(out.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                                 out.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start._0_1_);
                          local_3d0.span_.size_ = out_len;
                          testing::internal::CmpHelperEQ<Bytes,Bytes>
                                    ((internal *)local_3f0,"Bytes(msg)","Bytes(out.data(), out_len)"
                                     ,(Bytes *)local_3b8,&local_3d0);
                          if (local_3f0[0] == (internal)0x0) {
                            testing::Message::Message((Message *)local_3b8);
                            if (local_3e8 ==
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )0x0) {
                              pcVar10 = "";
                            }
                            else {
                              pcVar10 = (local_3e8->_M_dataplus)._M_p;
                            }
                            testing::internal::AssertHelper::AssertHelper
                                      ((AssertHelper *)&local_3d0,kNonFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/aead_test.cc"
                                       ,0x3ae,pcVar10);
                            testing::internal::AssertHelper::operator=
                                      ((AssertHelper *)&local_3d0,(Message *)local_3b8);
                            testing::internal::AssertHelper::~AssertHelper
                                      ((AssertHelper *)&local_3d0);
                            if (local_3b8 != (undefined1  [8])0x0) {
                              (**(code **)(*(long *)local_3b8 + 8))();
                            }
                          }
                          if (local_3e8 !=
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0) {
                            std::
                            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&local_3e8,local_3e8);
                          }
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&out,(long)ct_and_tag.
                                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)ct_and_tag.
                                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                ._M_impl.super__Vector_impl_data._M_start);
                          puVar7 = iv.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish +
                                   -(long)iv.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_start;
                          iVar6 = EVP_AEAD_CTX_seal(&ctx.ctx_,
                                                    (uint8_t *)
                                                    CONCAT71(out.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                                  out.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._0_1_),
                                                  &out_len,(long)out.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)CONCAT71(out.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                                  out.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._0_1_),
                                                  iv.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (size_t)puVar7,
                                                  msg.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)msg.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)msg.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  aad.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)aad.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)aad.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                          local_3b8[0] = (internal)(iVar6 != 0);
                          local_3b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)0x0;
                          if (iVar6 == 0) {
                            testing::Message::Message((Message *)&local_3d0);
                            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                      ((string *)local_3f0,(internal *)local_3b8,
                                       (AssertionResult *)
                                       "EVP_AEAD_CTX_seal(ctx.get(), out.data(), &out_len, out.size(), iv.data(), iv.size(), msg.data(), msg.size(), aad.data(), aad.size())"
                                       ,"false","true",(char *)puVar7);
                            testing::internal::AssertHelper::AssertHelper
                                      (&local_3c0,kFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/aead_test.cc"
                                       ,0x3b4,(char *)local_3f0);
                            testing::internal::AssertHelper::operator=
                                      (&local_3c0,(Message *)&local_3d0);
                            testing::internal::AssertHelper::~AssertHelper(&local_3c0);
                            if (local_3f0 != (undefined1  [8])&local_3e0) {
                              operator_delete((void *)local_3f0,local_3e0._M_allocated_capacity + 1)
                              ;
                            }
                            __ptr_15 = local_3b0;
                            if ((long *)local_3d0.span_.data_ != (long *)0x0) {
                              (**(code **)(*(long *)local_3d0.span_.data_ + 8))();
                              __ptr_15 = local_3b0;
                            }
joined_r0x0023458d:
                            local_3b0 = __ptr_15;
                            if (__ptr_15 ==
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )0x0) goto LAB_0023481b;
                            pdVar8 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)(local_3b8 + 8);
                          }
                          else {
                            local_3b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)(ct_and_tag.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_finish +
                                           -(long)ct_and_tag.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                            local_3b8 = (undefined1  [8])
                                        ct_and_tag.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_start;
                            local_3d0.span_.data_ =
                                 (uchar *)CONCAT71(out.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                                  out.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._0_1_);
                            local_3d0.span_.size_ = out_len;
                            testing::internal::CmpHelperEQ<Bytes,Bytes>
                                      ((internal *)local_3f0,"Bytes(ct_and_tag)",
                                       "Bytes(out.data(), out_len)",(Bytes *)local_3b8,&local_3d0);
                            if (local_3f0[0] == (internal)0x0) {
                              testing::Message::Message((Message *)local_3b8);
                              if (local_3e8 ==
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                pcVar10 = "";
                              }
                              else {
                                pcVar10 = (local_3e8->_M_dataplus)._M_p;
                              }
                              testing::internal::AssertHelper::AssertHelper
                                        ((AssertHelper *)&local_3d0,kNonFatalFailure,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/aead_test.cc"
                                         ,0x3b5,pcVar10);
                              testing::internal::AssertHelper::operator=
                                        ((AssertHelper *)&local_3d0,(Message *)local_3b8);
                              testing::internal::AssertHelper::~AssertHelper
                                        ((AssertHelper *)&local_3d0);
                              if (local_3b8 != (undefined1  [8])0x0) {
                                (**(code **)(*(long *)local_3b8 + 8))();
                              }
                            }
                            if (local_3e8 !=
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )0x0) {
                              std::
                              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                            *)&local_3e8,local_3e8);
                            }
                            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                                      (&out,&msg);
                            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                      (&out,(long)ct_and_tag.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                            (long)ct_and_tag.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                            puVar2 = (uint8_t *)
                                     CONCAT71(out.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                              out.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_start._0_1_);
                            puVar7 = iv.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_finish +
                                     -(long)iv.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_start;
                            iVar6 = EVP_AEAD_CTX_seal(&ctx.ctx_,puVar2,&out_len,
                                                      (long)out.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)puVar2,
                                                  iv.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (size_t)puVar7,puVar2,
                                                  (long)msg.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)msg.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  aad.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)aad.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)aad.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                            local_3b8[0] = (internal)(iVar6 != 0);
                            local_3b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)0x0;
                            if (iVar6 == 0) {
                              testing::Message::Message((Message *)&local_3d0);
                              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                        ((string *)local_3f0,(internal *)local_3b8,
                                         (AssertionResult *)
                                         "EVP_AEAD_CTX_seal(ctx.get(), out.data(), &out_len, out.size(), iv.data(), iv.size(), out.data(), msg.size(), aad.data(), aad.size())"
                                         ,"false","true",(char *)puVar7);
                              testing::internal::AssertHelper::AssertHelper
                                        (&local_3c0,kFatalFailure,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/aead_test.cc"
                                         ,0x3bc,(char *)local_3f0);
                              testing::internal::AssertHelper::operator=
                                        (&local_3c0,(Message *)&local_3d0);
                              testing::internal::AssertHelper::~AssertHelper(&local_3c0);
                              if (local_3f0 != (undefined1  [8])&local_3e0) {
                                operator_delete((void *)local_3f0,
                                                local_3e0._M_allocated_capacity + 1);
                              }
                              __ptr_15 = local_3b0;
                              if ((long *)local_3d0.span_.data_ != (long *)0x0) {
                                (**(code **)(*(long *)local_3d0.span_.data_ + 8))();
                                __ptr_15 = local_3b0;
                              }
                              goto joined_r0x0023458d;
                            }
                            local_3b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)(ct_and_tag.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_finish +
                                           -(long)ct_and_tag.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                            local_3b8 = (undefined1  [8])
                                        ct_and_tag.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_start;
                            local_3d0.span_.data_ =
                                 (uchar *)CONCAT71(out.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                                  out.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._0_1_);
                            local_3d0.span_.size_ = out_len;
                            testing::internal::CmpHelperEQ<Bytes,Bytes>
                                      ((internal *)local_3f0,"Bytes(ct_and_tag)",
                                       "Bytes(out.data(), out_len)",(Bytes *)local_3b8,&local_3d0);
                            if (local_3f0[0] == (internal)0x0) {
                              testing::Message::Message((Message *)local_3b8);
                              if (local_3e8 ==
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                pcVar10 = "";
                              }
                              else {
                                pcVar10 = (local_3e8->_M_dataplus)._M_p;
                              }
                              testing::internal::AssertHelper::AssertHelper
                                        ((AssertHelper *)&local_3d0,kNonFatalFailure,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/aead_test.cc"
                                         ,0x3bd,pcVar10);
                              testing::internal::AssertHelper::operator=
                                        ((AssertHelper *)&local_3d0,(Message *)local_3b8);
                              testing::internal::AssertHelper::~AssertHelper
                                        ((AssertHelper *)&local_3d0);
                              if (local_3b8 != (undefined1  [8])0x0) {
                                (**(code **)(*(long *)local_3b8 + 8))();
                              }
                            }
                            if (local_3e8 ==
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )0x0) goto LAB_0023481b;
                            pdVar8 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)&local_3e8;
                            __ptr_15 = local_3e8;
                          }
                          std::
                          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::operator()(pdVar8,__ptr_15);
                          goto LAB_0023481b;
                        }
                        testing::Message::Message((Message *)&local_3d0);
                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                  ((string *)local_3f0,(internal *)local_3b8,
                                   (AssertionResult *)
                                   "EVP_AEAD_CTX_open(ctx.get(), out.data(), &out_len, out.size(), iv.data(), iv.size(), out.data(), out.size(), aad.data(), aad.size())"
                                   ,"false","true",(char *)puVar7);
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_3c0,kFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/aead_test.cc"
                                   ,0x3ad,(char *)local_3f0);
                        testing::internal::AssertHelper::operator=(&local_3c0,(Message *)&local_3d0)
                        ;
                        testing::internal::AssertHelper::~AssertHelper(&local_3c0);
                        if (local_3f0 != (undefined1  [8])&local_3e0) {
                          operator_delete((void *)local_3f0,local_3e0._M_allocated_capacity + 1);
                        }
                        if ((long *)local_3d0.span_.data_ != (long *)0x0) {
                          (**(code **)(*(long *)local_3d0.span_.data_ + 8))();
                        }
                      }
joined_r0x0023417e:
                      if (local_3b0 !=
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                      {
                        std::
                        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)(local_3b8 + 8),local_3b0);
                      }
                    }
                    else {
                      puVar7 = iv.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish +
                               -(long)iv.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start;
                      iVar6 = EVP_AEAD_CTX_open(&ctx.ctx_,
                                                (uint8_t *)
                                                CONCAT71(out.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                                  out.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._0_1_),
                                                &out_len,(long)out.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)CONCAT71(out.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                                  out.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._0_1_),
                                                iv.
                                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                ._M_impl.super__Vector_impl_data._M_start,
                                                (size_t)puVar7,
                                                ct_and_tag.
                                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                ._M_impl.super__Vector_impl_data._M_start,
                                                (long)ct_and_tag.
                                                                                                            
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                (long)ct_and_tag.
                                                                                                            
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                aad.
                                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                ._M_impl.super__Vector_impl_data._M_start,
                                                (long)aad.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                (long)aad.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                      iVar12 = (internal)(iVar6 == 0);
                      local_3b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0;
                      local_3b8[0] = iVar12;
                      if (!(bool)iVar12) {
                        testing::Message::Message((Message *)&local_3d0);
                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                  ((string *)local_3f0,(internal *)local_3b8,
                                   (AssertionResult *)
                                   "EVP_AEAD_CTX_open(ctx.get(), out.data(), &out_len, out.size(), iv.data(), iv.size(), ct_and_tag.data(), ct_and_tag.size(), aad.data(), aad.size())"
                                   ,"true","false",(char *)puVar7);
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_3c0,kNonFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/aead_test.cc"
                                   ,0x3c2,(char *)local_3f0);
                        testing::internal::AssertHelper::operator=(&local_3c0,(Message *)&local_3d0)
                        ;
                        testing::internal::AssertHelper::~AssertHelper(&local_3c0);
                        if (local_3f0 != (undefined1  [8])&local_3e0) {
                          operator_delete((void *)local_3f0,local_3e0._M_allocated_capacity + 1);
                        }
                        if ((long *)local_3d0.span_.data_ != (long *)0x0) {
                          (**(code **)(*(long *)local_3d0.span_.data_ + 8))();
                        }
                        if (local_3b0 !=
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                           ) {
                          std::
                          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)(local_3b8 + 8),local_3b0);
                        }
                      }
                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                                (&out,&ct_and_tag);
                      puVar2 = (uint8_t *)
                               CONCAT71(out.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                        out.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_start._0_1_);
                      puVar7 = iv.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish +
                               -(long)iv.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start;
                      iVar6 = EVP_AEAD_CTX_open(&ctx.ctx_,puVar2,&out_len,
                                                (long)out.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                (long)puVar2,
                                                iv.
                                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                ._M_impl.super__Vector_impl_data._M_start,
                                                (size_t)puVar7,puVar2,
                                                (long)out.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                (long)puVar2,
                                                aad.
                                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                ._M_impl.super__Vector_impl_data._M_start,
                                                (long)aad.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                (long)aad.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                      local_3b8[0] = (internal)(iVar6 == 0);
                      local_3b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0;
                      if (iVar6 != 0) {
                        testing::Message::Message((Message *)&local_3d0);
                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                  ((string *)local_3f0,(internal *)local_3b8,
                                   (AssertionResult *)
                                   "EVP_AEAD_CTX_open(ctx.get(), out.data(), &out_len, out.size(), iv.data(), iv.size(), out.data(), out.size(), aad.data(), aad.size())"
                                   ,"true","false",(char *)puVar7);
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_3c0,kNonFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/aead_test.cc"
                                   ,0x3c8,(char *)local_3f0);
                        testing::internal::AssertHelper::operator=(&local_3c0,(Message *)&local_3d0)
                        ;
                        testing::internal::AssertHelper::~AssertHelper(&local_3c0);
                        if (local_3f0 != (undefined1  [8])&local_3e0) {
                          operator_delete((void *)local_3f0,local_3e0._M_allocated_capacity + 1);
                        }
                        if ((long *)local_3d0.span_.data_ != (long *)0x0) {
                          (**(code **)(*(long *)local_3d0.span_.data_ + 8))();
                        }
                        goto joined_r0x0023417e;
                      }
                    }
LAB_0023481b:
                    pvVar3 = (void *)CONCAT71(out.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                              out.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_start._0_1_);
                    if (pvVar3 != (void *)0x0) {
                      operator_delete(pvVar3,(long)out.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                             - (long)pvVar3);
                    }
                  }
                  EVP_AEAD_CTX_cleanup(&ctx.ctx_);
                  if (ct_and_tag.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(ct_and_tag.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                                    (long)ct_and_tag.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)ct_and_tag.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
                  }
                }
                else {
                  testing::Message::Message((Message *)&ct_and_tag);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)&ctx,(internal *)local_3f0,
                             (AssertionResult *)"GetWycheproofResult(t, &result)","false","true",
                             in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&out,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/aead_test.cc"
                             ,0x395,(char *)ctx.ctx_.aead);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&out,(Message *)&ct_and_tag);
                  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&out);
                  if (ctx.ctx_.aead != pEVar1) {
                    operator_delete(ctx.ctx_.aead,ctx.ctx_.state._8_8_ + 1);
                  }
                  if (ct_and_tag.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                    (**(code **)(*(long *)ct_and_tag.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_start + 8))();
                  }
                  if (local_3e8 !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    std::
                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&local_3e8,local_3e8);
                  }
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&result.flags);
              }
LAB_00234864:
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)tag_size_str._M_dataplus._M_p != &tag_size_str.field_2) {
                operator_delete(tag_size_str._M_dataplus._M_p,
                                CONCAT71(tag_size_str.field_2._M_allocated_capacity._1_7_,
                                         tag_size_str.field_2._M_local_buf[0]) + 1);
              }
              goto LAB_002338ce;
            }
          }
          testing::Message::Message((Message *)&result);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&ctx,(internal *)&tag_size_str,
                     (AssertionResult *)"t->GetBytes(&tag, \"tag\")","false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_3f0,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/aead_test.cc"
                     ,0x38e,(char *)ctx.ctx_.aead);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_3f0,(Message *)&result);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3f0);
          if (ctx.ctx_.aead != pEVar1) {
            operator_delete(ctx.ctx_.aead,ctx.ctx_.state._8_8_ + 1);
          }
          if (result._0_8_ != 0) {
            (**(code **)(*(long *)result._0_8_ + 8))();
          }
          goto joined_r0x00233748;
        }
      }
      else {
        operator_delete(ctx.ctx_.aead,ctx.ctx_.state._8_8_ + 1);
        if (((ulong)tag_size_str._M_dataplus._M_p & 1) != 0) goto LAB_00233222;
      }
      testing::Message::Message((Message *)&result);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&ctx,(internal *)&tag_size_str,
                 (AssertionResult *)"t->GetBytes(&msg, \"msg\")","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_3f0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/aead_test.cc"
                 ,0x38d,(char *)ctx.ctx_.aead);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_3f0,(Message *)&result);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3f0);
      if (ctx.ctx_.aead != pEVar1) {
        operator_delete(ctx.ctx_.aead,ctx.ctx_.state._8_8_ + 1);
      }
      if (result._0_8_ != 0) {
        (**(code **)(*(long *)result._0_8_ + 8))();
      }
    }
  }
joined_r0x00233748:
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      tag_size_str._M_string_length !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&tag_size_str._M_string_length,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 tag_size_str._M_string_length);
  }
LAB_002338ce:
  if (tag.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(tag.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)tag.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)tag.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (msg.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(msg.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)msg.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)msg.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (iv.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(iv.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)iv.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)iv.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (ct.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(ct.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)ct.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)ct.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (aad.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(aad.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)aad.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)aad.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

static void RunWycheproofTestCase(FileTest *t, const EVP_AEAD *aead) {
  t->IgnoreInstruction("ivSize");

  std::vector<uint8_t> aad, ct, iv, key, msg, tag;
  ASSERT_TRUE(t->GetBytes(&aad, "aad"));
  ASSERT_TRUE(t->GetBytes(&ct, "ct"));
  ASSERT_TRUE(t->GetBytes(&iv, "iv"));
  ASSERT_TRUE(t->GetBytes(&key, "key"));
  ASSERT_TRUE(t->GetBytes(&msg, "msg"));
  ASSERT_TRUE(t->GetBytes(&tag, "tag"));
  std::string tag_size_str;
  ASSERT_TRUE(t->GetInstruction(&tag_size_str, "tagSize"));
  size_t tag_size = static_cast<size_t>(atoi(tag_size_str.c_str()));
  ASSERT_EQ(0u, tag_size % 8);
  tag_size /= 8;
  WycheproofResult result;
  ASSERT_TRUE(GetWycheproofResult(t, &result));

  std::vector<uint8_t> ct_and_tag = ct;
  ct_and_tag.insert(ct_and_tag.end(), tag.begin(), tag.end());

  bssl::ScopedEVP_AEAD_CTX ctx;
  ASSERT_TRUE(EVP_AEAD_CTX_init(ctx.get(), aead, key.data(), key.size(),
                                tag_size, nullptr));
  std::vector<uint8_t> out(msg.size());
  size_t out_len;
  // Wycheproof tags small AES-GCM IVs as "acceptable" and otherwise does not
  // use it in AEADs. Any AES-GCM IV that isn't 96 bits is absurd, but our API
  // supports those, so we treat SmallIv tests as valid.
  if (result.IsValid({"SmallIv"})) {
    // Decryption should succeed.
    ASSERT_TRUE(EVP_AEAD_CTX_open(ctx.get(), out.data(), &out_len, out.size(),
                                  iv.data(), iv.size(), ct_and_tag.data(),
                                  ct_and_tag.size(), aad.data(), aad.size()));
    EXPECT_EQ(Bytes(msg), Bytes(out.data(), out_len));

    // Decryption in-place should succeed.
    out = ct_and_tag;
    ASSERT_TRUE(EVP_AEAD_CTX_open(ctx.get(), out.data(), &out_len, out.size(),
                                  iv.data(), iv.size(), out.data(), out.size(),
                                  aad.data(), aad.size()));
    EXPECT_EQ(Bytes(msg), Bytes(out.data(), out_len));

    // AEADs are deterministic, so encryption should produce the same result.
    out.resize(ct_and_tag.size());
    ASSERT_TRUE(EVP_AEAD_CTX_seal(ctx.get(), out.data(), &out_len, out.size(),
                                  iv.data(), iv.size(), msg.data(), msg.size(),
                                  aad.data(), aad.size()));
    EXPECT_EQ(Bytes(ct_and_tag), Bytes(out.data(), out_len));

    // Encrypt in-place.
    out = msg;
    out.resize(ct_and_tag.size());
    ASSERT_TRUE(EVP_AEAD_CTX_seal(ctx.get(), out.data(), &out_len, out.size(),
                                  iv.data(), iv.size(), out.data(), msg.size(),
                                  aad.data(), aad.size()));
    EXPECT_EQ(Bytes(ct_and_tag), Bytes(out.data(), out_len));
  } else {
    // Decryption should fail.
    EXPECT_FALSE(EVP_AEAD_CTX_open(ctx.get(), out.data(), &out_len, out.size(),
                                   iv.data(), iv.size(), ct_and_tag.data(),
                                   ct_and_tag.size(), aad.data(), aad.size()));

    // Decryption in-place should also fail.
    out = ct_and_tag;
    EXPECT_FALSE(EVP_AEAD_CTX_open(ctx.get(), out.data(), &out_len, out.size(),
                                   iv.data(), iv.size(), out.data(), out.size(),
                                   aad.data(), aad.size()));
  }
}